

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileMtlImporter::getTexture(ObjFileMtlImporter *this)

{
  uint uVar1;
  int iVar2;
  reference s1;
  char *pcVar3;
  Logger *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  undefined1 local_50 [8];
  string texture;
  bool clamp;
  char *pPtr;
  aiString *paStack_18;
  int clampIndex;
  aiString *out;
  ObjFileMtlImporter *this_local;
  
  paStack_18 = (aiString *)0x0;
  pPtr._4_4_ = 0xffffffff;
  out = (aiString *)this;
  s1 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator*
                 (&this->m_DataIt);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::size();
  iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
  if (iVar2 == 0) {
    paStack_18 = &this->m_pModel->m_pCurrentMaterial->texture;
    pPtr._4_4_ = 0;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    uVar1 = std::__cxx11::string::size();
    iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
    if (iVar2 == 0) {
      paStack_18 = &this->m_pModel->m_pCurrentMaterial->textureAmbient;
      pPtr._4_4_ = 2;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      uVar1 = std::__cxx11::string::size();
      iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
      if (iVar2 == 0) {
        paStack_18 = &this->m_pModel->m_pCurrentMaterial->textureSpecular;
        pPtr._4_4_ = 1;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        uVar1 = std::__cxx11::string::size();
        iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
        if (iVar2 != 0) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          uVar1 = std::__cxx11::string::size();
          iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
          if (iVar2 != 0) {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            uVar1 = std::__cxx11::string::size();
            iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
            if (iVar2 == 0) {
              paStack_18 = &this->m_pModel->m_pCurrentMaterial->textureOpacity;
              pPtr._4_4_ = 0xe;
            }
            else {
              pcVar3 = (char *)std::__cxx11::string::c_str();
              uVar1 = std::__cxx11::string::size();
              iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
              if (iVar2 != 0) {
                pcVar3 = (char *)std::__cxx11::string::c_str();
                uVar1 = std::__cxx11::string::size();
                iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
                if (iVar2 != 0) {
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  uVar1 = std::__cxx11::string::size();
                  iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
                  if (iVar2 != 0) {
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    uVar1 = std::__cxx11::string::size();
                    iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
                    if (iVar2 != 0) {
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      uVar1 = std::__cxx11::string::size();
                      iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
                      if (iVar2 == 0) {
                        paStack_18 = &this->m_pModel->m_pCurrentMaterial->textureNormal;
                        pPtr._4_4_ = 5;
                      }
                      else {
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        uVar1 = std::__cxx11::string::size();
                        iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
                        if (iVar2 == 0) {
                          return;
                        }
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        uVar1 = std::__cxx11::string::size();
                        iVar2 = ASSIMP_strincmp(s1,pcVar3,uVar1);
                        if (iVar2 != 0) {
                          this_00 = DefaultLogger::get();
                          Logger::error(this_00,"OBJ/MTL: Encountered unknown texture type");
                          return;
                        }
                        paStack_18 = &this->m_pModel->m_pCurrentMaterial->textureSpecularity;
                        pPtr._4_4_ = 0xd;
                      }
                      goto LAB_00b6b7f8;
                    }
                  }
                  paStack_18 = &this->m_pModel->m_pCurrentMaterial->textureBump;
                  pPtr._4_4_ = 4;
                  goto LAB_00b6b7f8;
                }
              }
              paStack_18 = &this->m_pModel->m_pCurrentMaterial->textureEmissive;
              pPtr._4_4_ = 3;
            }
            goto LAB_00b6b7f8;
          }
        }
        paStack_18 = &this->m_pModel->m_pCurrentMaterial->textureDisp;
        pPtr._4_4_ = 0xf;
      }
    }
  }
LAB_00b6b7f8:
  texture.field_2._M_local_buf[0xf] = '\0';
  getTextureOption(this,(bool *)(texture.field_2._M_local_buf + 0xf),(int *)((long)&pPtr + 4),
                   &stack0xffffffffffffffe8);
  this->m_pModel->m_pCurrentMaterial->clamp[pPtr._4_4_] =
       (bool)(texture.field_2._M_local_buf[0xf] & 1);
  std::__cxx11::string::string((string *)local_50);
  _Var4 = getName<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,(string *)local_50);
  (this->m_DataIt)._M_current = _Var4._M_current;
  if (paStack_18 != (aiString *)0x0) {
    aiString::Set(paStack_18,(string *)local_50);
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void ObjFileMtlImporter::getTexture() {
    aiString *out( NULL );
    int clampIndex = -1;

    const char *pPtr( &(*m_DataIt) );
    if ( !ASSIMP_strincmp( pPtr, DiffuseTexture.c_str(), static_cast<unsigned int>(DiffuseTexture.size()) ) ) {
        // Diffuse texture
        out = & m_pModel->m_pCurrentMaterial->texture;
        clampIndex = ObjFile::Material::TextureDiffuseType;
    } else if ( !ASSIMP_strincmp( pPtr,AmbientTexture.c_str(), static_cast<unsigned int>(AmbientTexture.size()) ) ) {
        // Ambient texture
        out = & m_pModel->m_pCurrentMaterial->textureAmbient;
        clampIndex = ObjFile::Material::TextureAmbientType;
    } else if ( !ASSIMP_strincmp( pPtr, SpecularTexture.c_str(), static_cast<unsigned int>(SpecularTexture.size()) ) ) {
        // Specular texture
        out = & m_pModel->m_pCurrentMaterial->textureSpecular;
        clampIndex = ObjFile::Material::TextureSpecularType;
    } else if ( !ASSIMP_strincmp( pPtr, DisplacementTexture1.c_str(), static_cast<unsigned int>(DisplacementTexture1.size()) ) ||
                !ASSIMP_strincmp( pPtr, DisplacementTexture2.c_str(), static_cast<unsigned int>(DisplacementTexture2.size()) ) ) {
        // Displacement texture
        out = &m_pModel->m_pCurrentMaterial->textureDisp;
        clampIndex = ObjFile::Material::TextureDispType;
    } else if ( !ASSIMP_strincmp( pPtr, OpacityTexture.c_str(), static_cast<unsigned int>(OpacityTexture.size()) ) ) {
        // Opacity texture
        out = & m_pModel->m_pCurrentMaterial->textureOpacity;
        clampIndex = ObjFile::Material::TextureOpacityType;
    } else if ( !ASSIMP_strincmp( pPtr, EmissiveTexture1.c_str(), static_cast<unsigned int>(EmissiveTexture1.size()) ) ||
                !ASSIMP_strincmp( pPtr, EmissiveTexture2.c_str(), static_cast<unsigned int>(EmissiveTexture2.size()) ) ) {
        // Emissive texture
        out = & m_pModel->m_pCurrentMaterial->textureEmissive;
        clampIndex = ObjFile::Material::TextureEmissiveType;
    } else if ( !ASSIMP_strincmp( pPtr, BumpTexture1.c_str(), static_cast<unsigned int>(BumpTexture1.size()) ) ||
                !ASSIMP_strincmp( pPtr, BumpTexture2.c_str(), static_cast<unsigned int>(BumpTexture2.size()) ) ) {
        // Bump texture
        out = & m_pModel->m_pCurrentMaterial->textureBump;
        clampIndex = ObjFile::Material::TextureBumpType;
    } else if ( !ASSIMP_strincmp( pPtr,NormalTexture.c_str(), static_cast<unsigned int>(NormalTexture.size()) ) ) {
        // Normal map
        out = & m_pModel->m_pCurrentMaterial->textureNormal;
        clampIndex = ObjFile::Material::TextureNormalType;
    } else if( !ASSIMP_strincmp( pPtr, ReflectionTexture.c_str(), static_cast<unsigned int>(ReflectionTexture.size()) ) ) {
        // Reflection texture(s)
        //Do nothing here
        return;
    } else if ( !ASSIMP_strincmp( pPtr, SpecularityTexture.c_str(), static_cast<unsigned int>(SpecularityTexture.size()) ) ) {
        // Specularity scaling (glossiness)
        out = & m_pModel->m_pCurrentMaterial->textureSpecularity;
        clampIndex = ObjFile::Material::TextureSpecularityType;
    } else {
        ASSIMP_LOG_ERROR("OBJ/MTL: Encountered unknown texture type");
        return;
    }

    bool clamp = false;
    getTextureOption(clamp, clampIndex, out);
    m_pModel->m_pCurrentMaterial->clamp[clampIndex] = clamp;

    std::string texture;
    m_DataIt = getName<DataArrayIt>( m_DataIt, m_DataItEnd, texture );
    if ( NULL!=out ) {
        out->Set( texture );
    }
}